

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragDepthTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::FragDepthWriteCase::iterate(FragDepthWriteCase *this)

{
  void **__return_storage_ptr__;
  code *pcVar1;
  code *pcVar2;
  EvalFragDepthFunc p_Var3;
  undefined *puVar4;
  bool bVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  deInt32 x_00;
  TestLog *log_00;
  RenderContext *pRVar13;
  deUint32 extraout_var;
  char *pcVar14;
  undefined4 extraout_var_00;
  NotSupportedError *this_01;
  TestError *pTVar15;
  float *pfVar16;
  float fVar17;
  float fVar18;
  char *local_938;
  VertexArrayBinding *local_800;
  RGBA local_700;
  int iStack_6fc;
  bool isOk;
  int local_6f8;
  int col;
  int step;
  float local_6ec;
  float local_6e8;
  float d;
  float yf;
  float xf;
  int x;
  int y;
  PrimitiveList local_6b0;
  undefined1 local_698 [8];
  VertexArrayBinding posBinding;
  float position_1 [16];
  Vec4 color;
  float depth;
  float f;
  int stepNdx;
  int colorLoc;
  int posLoc;
  allocator<char> local_5b9;
  string local_5b8;
  ProgramSources local_598;
  undefined1 local_4c8 [8];
  ShaderProgram program_1;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  void **local_390;
  undefined1 local_388 [8];
  VertexArrayBinding vertexArrays [2];
  float position [16];
  float coord [8];
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  ProgramSources local_230;
  undefined1 local_160 [8];
  ShaderProgram program;
  float depthStep;
  int numDepthSteps;
  Surface referenceFrame;
  Surface renderedFrame;
  int viewportY;
  int viewportX;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  Random rnd;
  Functions *gl;
  TestLog *log;
  FragDepthWriteCase *this_local;
  RenderTarget *this_00;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar13 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  rnd.m_rnd.z = (*pRVar13->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  pcVar14 = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(pcVar14);
  de::Random::Random((Random *)&renderTarget,dVar6);
  pRVar13 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar7 = (*pRVar13->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var_00,iVar7);
  iVar7 = tcu::RenderTarget::getWidth(this_00);
  iVar7 = de::min<int>(0x80,iVar7);
  iVar8 = tcu::RenderTarget::getHeight(this_00);
  iVar8 = de::min<int>(0x80,iVar8);
  iVar9 = tcu::RenderTarget::getWidth(this_00);
  iVar9 = de::Random::getInt((Random *)&renderTarget,0,iVar9 - iVar7);
  iVar10 = tcu::RenderTarget::getHeight(this_00);
  iVar10 = de::Random::getInt((Random *)&renderTarget,0,iVar10 - iVar8);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,iVar7,iVar8);
  tcu::Surface::Surface((Surface *)&depthStep,iVar7,iVar8);
  program.m_program.m_info.linkTimeUs._4_4_ = 0x10;
  program.m_program.m_info.linkTimeUs._0_4_ = 0x3d888889;
  iVar11 = tcu::RenderTarget::getDepthBits(this_00);
  if (iVar11 == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Depth buffer is required","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x136);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (**(code **)(rnd.m_rnd._8_8_ + 0x1a00))(iVar9,iVar10,iVar7,iVar8);
  (**(code **)(rnd.m_rnd._8_8_ + 0x188))(0x4500);
  (**(code **)(rnd.m_rnd._8_8_ + 0x5e0))(0xb71);
  (**(code **)(rnd.m_rnd._8_8_ + 0x4a0))(0x201);
  pRVar13 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  puVar4 = s_vertexShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,puVar4,&local_251);
  pcVar14 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,pcVar14,&local_279);
  glu::makeVtxFragSources(&local_230,&local_250,&local_278);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_160,pRVar13,&local_230);
  glu::ProgramSources::~ProgramSources(&local_230);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  glu::operator<<(log_00,(ShaderProgram *)local_160);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_160);
  if (!bVar5) {
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar15,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x145);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  position[0xe] = 0.0;
  position[0xf] = 0.0;
  position[10] = 1.0;
  position[0xb] = 1.0;
  position[0xc] = -1.0;
  position[0xd] = 1.0;
  position[6] = 1.0;
  position[7] = -1.0;
  position[8] = 0.0;
  position[9] = 1.0;
  position[2] = -1.0;
  position[3] = 1.0;
  position[4] = 0.0;
  position[5] = 1.0;
  vertexArrays[1].pointer.data = (void *)0xbf800000bf800000;
  position[0] = 1.0;
  position[1] = 1.0;
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  (*pcVar1)(dVar6);
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x15a0);
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0xb48);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  uVar12 = (*pcVar2)(dVar6,"u_color");
  (*pcVar1)(0,0x3f800000,uVar12);
  pRVar13 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  deqp::gls::setupDefaultUniforms(pRVar13,dVar6);
  local_390 = (void **)local_388;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"a_position",&local_3b1);
  glu::va::Float((VertexArrayBinding *)local_388,&local_3b0,4,4,0,
                 (float *)&vertexArrays[1].pointer.data);
  __return_storage_ptr__ = &vertexArrays[0].pointer.data;
  local_390 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"a_coord",&local_3d9);
  glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,&local_3d8,2,4,0,position + 0xe);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  pRVar13 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  glu::pr::Triangles((PrimitiveList *)&program_1.m_program.m_info.linkTimeUs,6,iterate::quadIndices)
  ;
  glu::draw(pRVar13,dVar6,2,(VertexArrayBinding *)local_388,
            (PrimitiveList *)&program_1.m_program.m_info.linkTimeUs,(DrawUtilCallback *)0x0);
  local_800 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
  do {
    local_800 = local_800 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_800);
  } while (local_800 != (VertexArrayBinding *)local_388);
  dVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar6,"Draw test quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                  ,0x166);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_160);
  pRVar13 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  puVar4 = s_vertexShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,puVar4,&local_5b9);
  puVar4 = s_defaultFragmentShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&posLoc,puVar4,(allocator<char> *)((long)&colorLoc + 3));
  glu::makeVtxFragSources(&local_598,&local_5b8,(string *)&posLoc);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_4c8,pRVar13,&local_598);
  glu::ProgramSources::~ProgramSources(&local_598);
  std::__cxx11::string::~string((string *)&posLoc);
  std::allocator<char>::~allocator((allocator<char> *)((long)&colorLoc + 3));
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_4c8);
  if (!bVar5) {
    glu::operator<<(log_00,(ShaderProgram *)local_4c8);
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar15,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x16f);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x780);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4c8);
  iVar7 = (*pcVar1)(dVar6,"a_position");
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0xb48);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4c8);
  uVar12 = (*pcVar1)(dVar6,"u_color");
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4c8);
  (*pcVar1)(dVar6);
  (**(code **)(rnd.m_rnd._8_8_ + 0x4a8))(0);
  for (depth = 0.0; (int)depth < 0x10; depth = (float)((int)depth + 1)) {
    fVar17 = (float)(int)depth * 0.06666667;
    fVar18 = fVar17 + fVar17 + -1.0;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(position_1 + 0xe),fVar17,fVar17,fVar17,1.0);
    posBinding.pointer.data._0_4_ = 0xbf800000;
    posBinding.pointer.data._4_4_ = 0xbf800000;
    position_1[1] = 1.0;
    position_1[2] = -1.0;
    position_1[3] = 1.0;
    position_1[5] = 1.0;
    position_1[6] = 1.0;
    position_1[7] = -1.0;
    position_1[9] = 1.0;
    position_1[10] = 1.0;
    position_1[0xb] = 1.0;
    position_1[0xd] = 1.0;
    position_1[0] = fVar18;
    position_1[4] = fVar18;
    position_1[8] = fVar18;
    position_1[0xc] = fVar18;
    glu::va::Float((VertexArrayBinding *)local_698,iVar7,4,4,0,(float *)&posBinding.pointer.data);
    pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x15a8);
    pfVar16 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)(position_1 + 0xe));
    (*pcVar1)(uVar12,1,pfVar16);
    pRVar13 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4c8);
    glu::pr::Triangles(&local_6b0,6,iterate::quadIndices);
    glu::draw(pRVar13,dVar6,1,(VertexArrayBinding *)local_698,&local_6b0,(DrawUtilCallback *)0x0);
    glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_698);
  }
  dVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar6,"Visualization draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                  ,0x18c);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_4c8);
  pRVar13 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&x,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(pRVar13,iVar9,iVar10,(PixelBufferAccess *)&x);
  for (xf = 0.0; fVar17 = xf, iVar7 = tcu::Surface::getHeight((Surface *)&depthStep),
      (int)fVar17 < iVar7; xf = (float)((int)xf + 1)) {
    for (yf = 0.0; fVar17 = yf, iVar7 = tcu::Surface::getWidth((Surface *)&depthStep),
        (int)fVar17 < iVar7; yf = (float)((int)yf + 1)) {
      fVar17 = (float)(int)yf;
      iVar7 = tcu::Surface::getWidth((Surface *)&depthStep);
      d = (fVar17 + 0.5) / (float)iVar7;
      fVar17 = (float)(int)xf;
      iVar7 = tcu::Surface::getHeight((Surface *)&depthStep);
      local_6e8 = (fVar17 + 0.5) / (float)iVar7;
      p_Var3 = this->m_evalFunc;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&col,d,local_6e8);
      local_6ec = (*p_Var3)((Vec2 *)&col);
      fVar17 = ::deFloatFloor(local_6ec / 0.06666667);
      local_6f8 = (int)fVar17;
      x_00 = ::deRoundFloatToInt32((float)local_6f8 * 0.06666667 * 255.0);
      iStack_6fc = de::clamp<int>(x_00,0,0xff);
      fVar18 = xf;
      fVar17 = yf;
      tcu::RGBA::RGBA(&local_700,iStack_6fc,iStack_6fc,iStack_6fc,0xff);
      tcu::Surface::setPixel((Surface *)&depthStep,(int)fVar17,(int)fVar18,local_700);
    }
  }
  bVar5 = tcu::fuzzyCompare(log_00,"Result","Image comparison result",(Surface *)&depthStep,
                            (Surface *)&referenceFrame.m_pixels.m_cap,0.05,COMPARE_LOG_RESULT);
  if (bVar5) {
    local_938 = "Pass";
  }
  else {
    local_938 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,local_938);
  tcu::Surface::~Surface((Surface *)&depthStep);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  de::Random::~Random((Random *)&renderTarget);
  return STOP;
}

Assistant:

FragDepthWriteCase::IterateResult FragDepthWriteCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();
	int							viewportW		= de::min(128, renderTarget.getWidth());
	int							viewportH		= de::min(128, renderTarget.getHeight());
	int							viewportX		= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	int							viewportY		= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame	(viewportW, viewportH);
	tcu::Surface				referenceFrame	(viewportW, viewportH);
	const int					numDepthSteps	= 16;
	const float					depthStep		= 1.0f/(float)(numDepthSteps-1);

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	gl.viewport(viewportX, viewportY, viewportW, viewportH);
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);
	gl.depthFunc(GL_LESS);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Render with given shader.
	{
		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, m_fragSrc.c_str()));
		log << program;

		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const float coord[] =
		{
			0.0f, 0.0f,
			0.0f, 1.0f,
			1.0f, 0.0f,
			1.0f, 1.0f
		};
		const float position[] =
		{
			-1.0f, -1.0f, +1.0f, 1.0f,
			-1.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		gl.useProgram(program.getProgram());
		gl.uniform4f(gl.getUniformLocation(program.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Setup default helper uniforms.
		gls::setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());

		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::va::Float("a_position",	4, 4, 0, &position[0]),
				glu::va::Float("a_coord",		2, 4, 0, &coord[0])
			};
			glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw test quad");
	}

	// Visualize by rendering full-screen quads with increasing depth and color.
	{
		glu::ShaderProgram program (m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_defaultFragmentShaderSrc));
		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Compile failed");
		}

		int posLoc		= gl.getAttribLocation(program.getProgram(), "a_position");
		int colorLoc	= gl.getUniformLocation(program.getProgram(), "u_color");

		gl.useProgram(program.getProgram());
		gl.depthMask(GL_FALSE);

		for (int stepNdx = 0; stepNdx < numDepthSteps; stepNdx++)
		{
			float	f		= (float)stepNdx*depthStep;
			float	depth	= f*2.0f - 1.0f;
			Vec4	color	= Vec4(f, f, f, 1.0f);

			const float position[] =
			{
				-1.0f, -1.0f, depth, 1.0f,
				-1.0f, +1.0f, depth, 1.0f,
				+1.0f, -1.0f, depth, 1.0f,
				+1.0f, +1.0f, depth, 1.0f
			};
			glu::VertexArrayBinding	posBinding = glu::va::Float(posLoc, 4, 4, 0, &position[0]);

			gl.uniform4fv(colorLoc, 1, color.getPtr());
			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Visualization draw");
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		for (int x = 0; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
			float	d		= m_evalFunc(Vec2(xf, yf));
			int		step	= (int)deFloatFloor(d / depthStep);
			int		col		= de::clamp(deRoundFloatToInt32((float)step*depthStep*255.0f), 0, 255);

			referenceFrame.setPixel(x, y, tcu::RGBA(col, col, col, 0xff));
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}